

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::tls1_check_group_id(SSL_HANDSHAKE *hs,uint16_t group_id)

{
  uint16_t *puVar1;
  bool bVar2;
  uint16_t uVar3;
  size_t sVar4;
  unsigned_short *puVar5;
  int iVar6;
  undefined6 in_register_00000032;
  long lVar7;
  bool bVar8;
  
  iVar6 = (int)CONCAT62(in_register_00000032,group_id);
  if (iVar6 == 0) {
    return false;
  }
  if (((iVar6 == 0x6399) || (iVar6 == 0x11ec)) &&
     (uVar3 = ssl_protocol_version(hs->ssl), uVar3 < 0x304)) {
    return false;
  }
  sVar4 = (hs->config->supported_group_list).size_;
  if (sVar4 == 0) {
    puVar5 = &kDefaultGroups;
    sVar4 = 3;
  }
  else {
    puVar5 = (hs->config->supported_group_list).data_;
  }
  lVar7 = 0;
  do {
    bVar8 = sVar4 * 2 == lVar7;
    bVar2 = !bVar8;
    if (bVar8) {
      return bVar2;
    }
    puVar1 = (uint16_t *)((long)puVar5 + lVar7);
    lVar7 = lVar7 + 2;
  } while (*puVar1 != group_id);
  return bVar2;
}

Assistant:

bool tls1_check_group_id(const SSL_HANDSHAKE *hs, uint16_t group_id) {
  if (is_post_quantum_group(group_id) &&
      ssl_protocol_version(hs->ssl) < TLS1_3_VERSION) {
    // Post-quantum "groups" require TLS 1.3.
    return false;
  }

  // We internally assume zero is never allocated as a group ID.
  if (group_id == 0) {
    return false;
  }

  for (uint16_t supported : tls1_get_grouplist(hs)) {
    if (supported == group_id) {
      return true;
    }
  }

  return false;
}